

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBlockMemoryAllocator.cpp
# Opt level: O0

void * __thiscall
Diligent::FixedBlockMemoryAllocator::Allocate
          (FixedBlockMemoryAllocator *this,size_t Size,Char *dbgDescription,char *dbgFileName,
          Int32 dbgLineNumber)

{
  bool bVar1;
  Char *pCVar2;
  reference puVar3;
  iterator __position;
  char (*in_stack_fffffffffffffec8) [2];
  pair<void_*,_unsigned_long> local_b8;
  void *local_a8;
  void *Ptr;
  value_type *Page;
  size_type local_90;
  unsigned_long PageId;
  lock_guard<std::mutex> LockGuard;
  string msg_1;
  undefined1 local_50 [8];
  string msg;
  Int32 dbgLineNumber_local;
  char *dbgFileName_local;
  Char *dbgDescription_local;
  size_t Size_local;
  FixedBlockMemoryAllocator *this_local;
  
  msg.field_2._12_4_ = dbgLineNumber;
  dbgDescription_local = (Char *)Size;
  Size_local = (size_t)this;
  if (Size == 0) {
    FormatString<char[26],char[9]>
              ((string *)local_50,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x495c50,
               (char (*) [9])dbgFileName);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
               ,0xd4);
    std::__cxx11::string::~string((string *)local_50);
  }
  dbgDescription_local = (Char *)AdjustBlockSize((size_t)dbgDescription_local);
  if ((Char *)this->m_BlockSize != dbgDescription_local) {
    FormatString<char[17],unsigned_long,char[34],unsigned_long,char[2]>
              ((string *)&LockGuard,(Diligent *)"Requested size (",
               (char (*) [17])&dbgDescription_local,
               (unsigned_long *)") does not match the block size (",
               (char (*) [34])&this->m_BlockSize,(unsigned_long *)0x46d916,in_stack_fffffffffffffec8
              );
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
               ,0xd7);
    std::__cxx11::string::~string((string *)&LockGuard);
  }
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&PageId,&this->m_Mutex);
  bVar1 = std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_Diligent::STDAllocator<unsigned_long,_Diligent::IMemoryAllocator>_>
          ::empty(&this->m_AvailablePages);
  if (bVar1) {
    CreateNewPage(this);
  }
  Page = (value_type *)
         std::
         unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_Diligent::STDAllocator<unsigned_long,_Diligent::IMemoryAllocator>_>
         ::begin(&this->m_AvailablePages);
  puVar3 = std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator*
                     ((_Node_iterator<unsigned_long,_true,_false> *)&Page);
  local_90 = *puVar3;
  Ptr = std::
        vector<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
        ::operator[](&this->m_PagePool,local_90);
  local_a8 = MemoryPage::Allocate((MemoryPage *)Ptr);
  local_b8 = std::make_pair<void*&,unsigned_long&>(&local_a8,&local_90);
  std::
  unordered_map<void*,unsigned_long,std::hash<void*>,std::equal_to<void*>,Diligent::STDAllocator<std::pair<void*const,unsigned_long>,Diligent::IMemoryAllocator>>
  ::insert<std::pair<void*,unsigned_long>>
            ((unordered_map<void*,unsigned_long,std::hash<void*>,std::equal_to<void*>,Diligent::STDAllocator<std::pair<void*const,unsigned_long>,Diligent::IMemoryAllocator>>
              *)&this->m_AddrToPageId,&local_b8);
  bVar1 = MemoryPage::HasSpace((MemoryPage *)Ptr);
  if (!bVar1) {
    __position = std::
                 unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_Diligent::STDAllocator<unsigned_long,_Diligent::IMemoryAllocator>_>
                 ::begin(&this->m_AvailablePages);
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_Diligent::STDAllocator<unsigned_long,_Diligent::IMemoryAllocator>_>
    ::erase(&this->m_AvailablePages,__position);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&PageId);
  return local_a8;
}

Assistant:

void* FixedBlockMemoryAllocator::Allocate(size_t Size, const Char* dbgDescription, const char* dbgFileName, const Int32 dbgLineNumber)
{
    VERIFY_EXPR(Size > 0);

    Size = AdjustBlockSize(Size);
    VERIFY(m_BlockSize == Size, "Requested size (", Size, ") does not match the block size (", m_BlockSize, ")");

    std::lock_guard<std::mutex> LockGuard(m_Mutex);

    if (m_AvailablePages.empty())
    {
        CreateNewPage();
    }

    auto  PageId = *m_AvailablePages.begin();
    auto& Page   = m_PagePool[PageId];
    auto* Ptr    = Page.Allocate();
    m_AddrToPageId.insert(std::make_pair(Ptr, PageId));
    if (!Page.HasSpace())
    {
        m_AvailablePages.erase(m_AvailablePages.begin());
    }

    return Ptr;
}